

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ClearStatTables(Parse *pParse,int iDb,char *zType,char *zName)

{
  char *zDatabase;
  Table *pTVar1;
  char local_58 [8];
  char zTab [24];
  char *zDbName;
  int i;
  char *zName_local;
  char *zType_local;
  int iDb_local;
  Parse *pParse_local;
  
  zDatabase = pParse->db->aDb[iDb].zDbSName;
  for (zDbName._4_4_ = 1; (int)zDbName._4_4_ < 5; zDbName._4_4_ = zDbName._4_4_ + 1) {
    sqlite3_snprintf(0x18,local_58,"sqlite_stat%d",(ulong)zDbName._4_4_);
    pTVar1 = sqlite3FindTable(pParse->db,local_58,zDatabase);
    if (pTVar1 != (Table *)0x0) {
      sqlite3NestedParse(pParse,"DELETE FROM %Q.%s WHERE %s=%Q",zDatabase,local_58,zType,zName);
    }
  }
  return;
}

Assistant:

static void sqlite3ClearStatTables(
  Parse *pParse,         /* The parsing context */
  int iDb,               /* The database number */
  const char *zType,     /* "idx" or "tbl" */
  const char *zName      /* Name of index or table */
){
  int i;
  const char *zDbName = pParse->db->aDb[iDb].zDbSName;
  for(i=1; i<=4; i++){
    char zTab[24];
    sqlite3_snprintf(sizeof(zTab),zTab,"sqlite_stat%d",i);
    if( sqlite3FindTable(pParse->db, zTab, zDbName) ){
      sqlite3NestedParse(pParse,
        "DELETE FROM %Q.%s WHERE %s=%Q",
        zDbName, zTab, zType, zName
      );
    }
  }
}